

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O0

int test_assert_multiple(ITesting *t)

{
  kTRContinueMode kVar1;
  kTRContinueMode tr_temp_res_2;
  kTRContinueMode tr_temp_res_1;
  TRUN_ConfigItem continueOnAssert;
  void *pvStack_20;
  kTRContinueMode tr_temp_res;
  ITestingConfig *trConfig;
  ITesting *t_local;
  
  pvStack_20 = (void *)0x0;
  trConfig = (ITestingConfig *)t;
  (*t->QueryInterface)(0xc07f19,&stack0xffffffffffffffe0);
  if ((pvStack_20 == (void *)0x0) &&
     (continueOnAssert.value._4_4_ =
           (*trConfig[3].List)(0x21,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                               ,"trConfig != nullptr"), continueOnAssert.value._4_4_ == kTRLeave)) {
    t_local._4_4_ = 0x10;
  }
  else {
    memset(&tr_temp_res_2,0,0x30);
    continueOnAssert.name[0x1f] = '\0';
    continueOnAssert._33_3_ = 0;
    (**(code **)((long)pvStack_20 + 8))("continue_on_assert",&tr_temp_res_2);
    if (((((undefined1)tr_temp_res_2 & kTRContinue) == kTRLeave) ||
        (continueOnAssert.name._27_4_ != 0)) || (continueOnAssert._32_4_ != 1)) {
      (*trConfig[1].Get)(0x25,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                         ,"\"Must run with \'continue on assert\' enabled!\"");
      t_local._4_4_ = 0x10;
    }
    else {
      kVar1 = (*trConfig[3].List)(0x27,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                  ,"1==2");
      if (kVar1 == kTRLeave) {
        t_local._4_4_ = 0x10;
      }
      else {
        kVar1 = (*trConfig[3].List)(0x28,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_assert.cpp"
                                    ,"true==false");
        if (kVar1 == kTRLeave) {
          t_local._4_4_ = 0x10;
        }
        else {
          t_local._4_4_ = 0;
        }
      }
    }
  }
  return t_local._4_4_;
}

Assistant:

DLL_EXPORT int test_assert_multiple(ITesting *t) {
    // t->SetDescription("Check if multiple assert values are allowed");

    ITestingConfig *trConfig = {};
    t->QueryInterface(ITestingConfig_IFace_ID, (void **)&trConfig);
    TR_ASSERT(t, trConfig != nullptr);
    TRUN_ConfigItem continueOnAssert = {};
    trConfig->Get("continue_on_assert", &continueOnAssert);
    // Verify - this is not an error..
    TR_REQUIRE(t, (continueOnAssert.isValid) && (continueOnAssert.value_type == kTRCfgType_Bool) && (continueOnAssert.value.boolean == true), "Must run with 'continue on assert' enabled!");

    TR_ASSERT(t, 1==2);
    TR_ASSERT(t, true==false);
    return kTR_Pass;
}